

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NAttrsCompare(void *data1,void *data2)

{
  undefined4 local_34;
  int ret;
  xmlAttr *attr2;
  xmlAttr *attr1;
  void *data2_local;
  void *data1_local;
  
  if (data1 == data2) {
    data1_local._4_4_ = 0;
  }
  else if (data1 == (void *)0x0) {
    data1_local._4_4_ = -1;
  }
  else if (data2 == (void *)0x0) {
    data1_local._4_4_ = 1;
  }
  else if (*(long *)((long)data1 + 0x48) == *(long *)((long)data2 + 0x48)) {
    data1_local._4_4_ =
         xmlStrcmp(*(xmlChar **)((long)data1 + 0x10),*(xmlChar **)((long)data2 + 0x10));
  }
  else if (*(long *)((long)data1 + 0x48) == 0) {
    data1_local._4_4_ = -1;
  }
  else if (*(long *)((long)data2 + 0x48) == 0) {
    data1_local._4_4_ = 1;
  }
  else if (*(long *)(*(long *)((long)data1 + 0x48) + 0x18) == 0) {
    data1_local._4_4_ = -1;
  }
  else if (*(long *)(*(long *)((long)data2 + 0x48) + 0x18) == 0) {
    data1_local._4_4_ = 1;
  }
  else {
    local_34 = xmlStrcmp(*(xmlChar **)(*(long *)((long)data1 + 0x48) + 0x10),
                         *(xmlChar **)(*(long *)((long)data2 + 0x48) + 0x10));
    if (local_34 == 0) {
      local_34 = xmlStrcmp(*(xmlChar **)((long)data1 + 0x10),*(xmlChar **)((long)data2 + 0x10));
    }
    data1_local._4_4_ = local_34;
  }
  return data1_local._4_4_;
}

Assistant:

static int
xmlC14NAttrsCompare(const void *data1, const void *data2)
{
    const xmlAttr *attr1 = data1;
    const xmlAttr *attr2 = data2;
    int ret = 0;

    /*
     * Simple cases
     */
    if (attr1 == attr2)
        return (0);
    if (attr1 == NULL)
        return (-1);
    if (attr2 == NULL)
        return (1);
    if (attr1->ns == attr2->ns) {
        return (xmlStrcmp(attr1->name, attr2->name));
    }

    /*
     * Attributes in the default namespace are first
     * because the default namespace is not applied to
     * unqualified attributes
     */
    if (attr1->ns == NULL)
        return (-1);
    if (attr2->ns == NULL)
        return (1);
    if (attr1->ns->prefix == NULL)
        return (-1);
    if (attr2->ns->prefix == NULL)
        return (1);

    ret = xmlStrcmp(attr1->ns->href, attr2->ns->href);
    if (ret == 0) {
        ret = xmlStrcmp(attr1->name, attr2->name);
    }
    return (ret);
}